

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
SetPropertyFromDescriptor<false,int>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<int> *descriptor,Var value,PropertyOperationFlags flags
          ,PropertyValueInfo *info)

{
  Type *pTVar1;
  JavascriptString *str1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  JavascriptString **ppJVar10;
  UndeclaredBlockVariable *pUVar11;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *pSVar12;
  PropertyRecord *pPVar13;
  ulong uVar14;
  _func_int *UNRECOVERED_JUMPTABLE;
  int local_64;
  PropertyOperationFlags PStack_60;
  int propertyIndex;
  PropertyValueInfo *local_58;
  SimpleDictionaryPropertyDescriptor<int> *local_50;
  Var local_48;
  ScriptContext *local_40;
  DynamicObject *local_38;
  
  local_58 = info;
  local_48 = value;
  if (instance == (DynamicObject *)0x0) {
    _PStack_60 = (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)
                 CONCAT44(propertyIndex,flags);
    AssertCount = AssertCount + 1;
    local_38 = instance;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar4) goto LAB_00cb51c5;
    *puVar9 = 0;
    instance = local_38;
    flags = PStack_60;
  }
  bVar5 = descriptor->Attributes;
  if ((bVar5 & 0x10) != 0) {
    pSVar12 = (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)
              SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
              ConvertToDictionaryType
                        ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this
                         ,instance);
    UNRECOVERED_JUMPTABLE = (pSVar12->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17];
    uVar14 = (ulong)(uint)propertyId;
LAB_00cb4cd8:
    iVar7 = (*UNRECOVERED_JUMPTABLE)(pSVar12,instance,uVar14,local_48,(ulong)flags,local_58);
    return iVar7;
  }
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  local_40 = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((bVar5 & 8) == 0) {
    if ((flags & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (bVar5 & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(flags,local_40);
      if (local_58 == (PropertyValueInfo *)0x0) {
        return 0;
      }
      local_58->m_instance = &instance->super_RecyclableObject;
      local_58->m_propertyIndex = 0xffff;
      local_58->m_attributes = '\0';
      local_58->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar12 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)
                           this,instance);
      UNRECOVERED_JUMPTABLE = (pSVar12->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17];
      uVar14 = (ulong)(uint)propertyKey;
      goto LAB_00cb4cd8;
    }
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        local_38 = instance;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00cb51c5;
        *puVar9 = 0;
        instance = local_38;
      }
      DynamicObject::ChangeType(instance);
    }
    local_50 = descriptor;
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar4 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>
                                     *)this,instance,descriptor->propertyIndex,&local_64), bVar4)) {
      _PStack_60 = (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this;
      ppJVar10 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                              **)(this + 0x18),local_64);
      str1 = *ppJVar10;
      pPVar13 = ScriptContext::GetPropertyName(local_40,propertyKey);
      bVar4 = PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals(str1,pPVar13);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar4) goto LAB_00cb51c5;
        *puVar9 = 0;
      }
      this = (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)_PStack_60;
      local_50 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt((_PStack_60->propertyMap).ptr,local_64);
    }
    bVar4 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this,
                       local_40);
    if (bVar4) {
      ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this)->
      numDeletedProperties =
           ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this)->
           numDeletedProperties + 0xff;
    }
    local_50->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    if (propertyKey != -1) {
      ScriptContext::InvalidateProtoCaches(local_40,propertyKey);
    }
    local_50->Attributes = '\a';
    bVar5 = 7;
    descriptor = local_50;
    propertyId = propertyKey;
  }
  local_50 = (SimpleDictionaryPropertyDescriptor<int> *)CONCAT44(local_50._4_4_,propertyId);
  if (descriptor->propertyIndex == -1) goto LAB_00cb5148;
  if (((-1 < (char)flags && 0x3f < bVar5) &&
      (pUVar11 = (UndeclaredBlockVariable *)
                 DynamicObject::GetSlot(instance,descriptor->propertyIndex), (flags >> 8 & 1) == 0))
     && ((((local_40->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
         pUVar11)) {
    JavascriptError::ThrowReferenceError(local_40,-0x7ff5ec07,(PCWSTR)0x0);
  }
  pRVar2 = (((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this)->
           singletonInstance).ptr;
  if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    bVar4 = false;
  }
  else if ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == instance) {
    bVar4 = true;
  }
  else {
    _PStack_60 = (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)
                 CONCAT44(propertyIndex,flags);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x588,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar4) goto LAB_00cb51c5;
    *puVar9 = 0;
    bVar4 = false;
    flags = PStack_60;
  }
  if ((*(byte *)descriptor & 2) == 0) {
    if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)descriptor = *(byte *)descriptor | 2, bVar4)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < (uint)propertyKey)) {
      local_38 = instance;
      if (((((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *)this)->
           super_DynamicTypeHandler).flags & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x594,"(!GetIsShared())","!GetIsShared()");
        if (!bVar4) goto LAB_00cb51c5;
        *puVar9 = 0;
      }
      if (local_48 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x595,"(value != nullptr)","value != nullptr");
        if (!bVar4) goto LAB_00cb51c5;
        *puVar9 = 0;
      }
      instance = local_38;
      BVar8 = RecyclableObject::IsExternal(&local_38->super_RecyclableObject);
      if (BVar8 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar4) {
LAB_00cb51c5:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
        instance = local_38;
      }
      bVar4 = VarIs<Js::JavascriptFunction>(local_48);
      if (bVar4) {
        bVar4 = DynamicTypeHandler::ShouldFixMethodProperties();
LAB_00cb51a0:
        bVar5 = *(byte *)descriptor;
        if (bVar4 == false) goto LAB_00cb51b6;
        bVar6 = 4;
      }
      else {
        bVar4 = DynamicTypeHandler::ShouldFixDataProperties();
        if (bVar4) {
          bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                            (instance,(PropertyId)local_50,local_48);
          goto LAB_00cb51a0;
        }
        bVar5 = *(byte *)descriptor;
LAB_00cb51b6:
        bVar6 = 0;
      }
      *(byte *)descriptor = bVar5 & 0xfb | bVar6;
    }
  }
  else {
    pPVar13 = ScriptContext::GetPropertyName(local_40,propertyKey);
    InvalidateFixedField<Js::PropertyRecord_const*>
              (this,pPVar13,descriptor,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,descriptor->propertyIndex,local_48);
  if (local_58 != (PropertyValueInfo *)0x0) {
    local_58->m_instance = &instance->super_RecyclableObject;
    local_58->m_propertyIndex = 0xffff;
    local_58->m_attributes = '\0';
    local_58->flags = InlineCacheNoFlags;
  }
LAB_00cb5148:
  TPropertyKey_GetUpdateSideEffectPropertyId<int>((PropertyId)local_50,propertyKey);
  if (propertyKey != -1) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,propertyKey,local_48,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }